

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

bool __thiscall absl::CondVar::WaitWithDeadline(CondVar *this,Mutex *mu,Time deadline)

{
  bool bVar1;
  KernelTimeout t;
  Time t_00;
  
  t_00.rep_._12_4_ = 0;
  t_00.rep_.rep_hi_ = SUB128(deadline.rep_._0_12_,0);
  t_00.rep_.rep_lo_ = SUB124(deadline.rep_._0_12_,8);
  t.ns_ = synchronization_internal::KernelTimeout::MakeNs(t_00);
  bVar1 = WaitCommon(this,mu,t);
  return bVar1;
}

Assistant:

bool CondVar::WaitWithDeadline(Mutex *mu, absl::Time deadline) {
  return WaitCommon(mu, KernelTimeout(deadline));
}